

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

bool IsVirtualFunctionCall(ExpressionContext *ctx,FunctionData *function,TypeBase *type)

{
  _func_int **pp_Var1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  InplaceStr IVar6;
  
  if (function == (FunctionData *)0x0) {
    __assert_fail("function",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x19ba,
                  "bool IsVirtualFunctionCall(ExpressionContext &, FunctionData *, TypeBase *)");
  }
  if (ctx->typeAutoRef == (TypeStruct *)type) {
    bVar2 = true;
  }
  else {
    if ((((type != (TypeBase *)0x0) && (type->typeID == 0x12)) &&
        (pp_Var1 = type[1]._vptr_TypeBase, pp_Var1 != (_func_int **)0x0)) &&
       ((*(int *)(pp_Var1 + 1) == 0x18 &&
        ((*(char *)(pp_Var1 + 0x22) != '\0' || (pp_Var1[0x23] != (_func_int *)0x0)))))) {
      uVar3 = NULLC::StringHashContinue(*(uint *)((long)pp_Var1 + 0xc),"::");
      pp_Var5 = (_func_int **)pp_Var1[0x1d];
      if ((_func_int **)pp_Var1[0x1d] == (_func_int **)0x0) {
        pp_Var5 = pp_Var1;
      }
      IVar6 = GetTypeConstructorName(*(InplaceStr *)(pp_Var5 + 2));
      uVar4 = NULLC::StringHashContinue(uVar3,IVar6.begin,IVar6.end);
      uVar3 = function->nameHash;
      if (uVar3 != uVar4) {
        uVar4 = NULLC::StringHashContinue(uVar4,"$");
        return uVar3 != uVar4;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsVirtualFunctionCall(ExpressionContext &ctx, FunctionData *function, TypeBase *type)
{
	assert(function);

	if(type == ctx.typeAutoRef)
		return true;

	if(TypeRef *refType = getType<TypeRef>(type))
	{
		if(TypeClass *classType = getType<TypeClass>(refType->subType))
		{
			if(classType->extendable || classType->baseClass != NULL)
			{
				unsigned hash = NULLC::StringHashContinue(classType->nameHash, "::");

				InplaceStr constructor = GetTypeConstructorName(classType);

				hash = NULLC::StringHashContinue(hash, constructor.begin, constructor.end);

				if(function->nameHash == hash || function->nameHash == NULLC::StringHashContinue(hash, "$"))
					return false;

				return true;
			}
		}
	}

	return false;
}